

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptFields.cpp
# Opt level: O0

bool __thiscall GlobOpt::DoFieldCopyProp(GlobOpt *this,Loop *loop)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  Loop *loop_local;
  GlobOpt *this_local;
  
  uVar2 = Func::GetSourceContextId(this->func);
  uVar3 = Func::GetLocalFunctionId(this->func);
  bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,CopyPropPhase,uVar2,uVar3);
  if (bVar1) {
    this_local._7_1_ = false;
  }
  else {
    uVar2 = Func::GetSourceContextId(this->func);
    uVar3 = Func::GetLocalFunctionId(this->func);
    bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01ea41a0,FieldCopyPropPhase,uVar2,uVar3);
    if (bVar1) {
      this_local._7_1_ = true;
    }
    else {
      uVar2 = Func::GetSourceContextId(this->func);
      uVar3 = Func::GetLocalFunctionId(this->func);
      bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,FieldCopyPropPhase,uVar2,uVar3);
      if (bVar1) {
        this_local._7_1_ = false;
      }
      else {
        this_local._7_1_ = DoFieldOpts(this,loop);
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool
GlobOpt::DoFieldCopyProp(Loop * loop) const
{
    if (PHASE_OFF(Js::CopyPropPhase, this->func))
    {
        // Can't do field copy prop without copy prop
        return false;
    }

    if (PHASE_FORCE(Js::FieldCopyPropPhase, this->func))
    {
        // Force always turns on field copy prop
        return true;
    }

    if (PHASE_OFF(Js::FieldCopyPropPhase, this->func))
    {
        return false;
    }

    return this->DoFieldOpts(loop);
}